

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char cVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  uint uVar22;
  int iVar23;
  int iVar49;
  int iVar50;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar51;
  vint4 bi;
  undefined1 auVar52 [16];
  vint4 bi_3;
  vint4 bi_1;
  vint4 ai_1;
  vint4 ai_3;
  vint4 ai;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_ZMM16 [64];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar18 = local_7d0;
  local_7d8 = root.ptr;
  auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 0.99999964)));
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 0.99999964)));
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 1.0000004)));
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 1.0000004)));
  auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 1.0000004)));
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
LAB_006e8f47:
  do {
    bVar7 = puVar18 != &local_7d8;
    if (puVar18 == &local_7d8) {
      return bVar7;
    }
    uVar15 = puVar18[-1];
    puVar18 = puVar18 + -1;
    while ((uVar15 & 8) == 0) {
      fVar4 = *(float *)(ray + k * 4 + 0x70);
      uVar13 = (uint)uVar15 & 7;
      uVar12 = uVar15 & 0xfffffffffffffff0;
      if (uVar13 == 3) {
        auVar35 = *(undefined1 (*) [16])(uVar12 + 0x80);
        auVar36 = *(undefined1 (*) [16])(uVar12 + 0x90);
        auVar37 = *(undefined1 (*) [16])(uVar12 + 0xa0);
        fVar5 = 1.0 - fVar4;
        auVar57._4_4_ = fVar5;
        auVar57._0_4_ = fVar5;
        auVar57._8_4_ = fVar5;
        auVar57._12_4_ = fVar5;
        auVar55._0_4_ = fVar4 * *(float *)(uVar12 + 0xe0);
        auVar55._4_4_ = fVar4 * *(float *)(uVar12 + 0xe4);
        auVar55._8_4_ = fVar4 * *(float *)(uVar12 + 0xe8);
        auVar55._12_4_ = fVar4 * *(float *)(uVar12 + 0xec);
        auVar40._0_4_ = fVar4 * *(float *)(uVar12 + 0xf0);
        auVar40._4_4_ = fVar4 * *(float *)(uVar12 + 0xf4);
        auVar40._8_4_ = fVar4 * *(float *)(uVar12 + 0xf8);
        auVar40._12_4_ = fVar4 * *(float *)(uVar12 + 0xfc);
        auVar54._0_4_ = fVar4 * *(float *)(uVar12 + 0x100);
        auVar54._4_4_ = fVar4 * *(float *)(uVar12 + 0x104);
        auVar54._8_4_ = fVar4 * *(float *)(uVar12 + 0x108);
        auVar54._12_4_ = fVar4 * *(float *)(uVar12 + 0x10c);
        auVar38 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar39 = vfmadd231ps_avx512vl(auVar55,auVar57,auVar38);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar57,auVar38);
        auVar59._0_4_ = fVar4 * *(float *)(uVar12 + 0x110);
        auVar59._4_4_ = fVar4 * *(float *)(uVar12 + 0x114);
        auVar59._8_4_ = fVar4 * *(float *)(uVar12 + 0x118);
        auVar59._12_4_ = fVar4 * *(float *)(uVar12 + 0x11c);
        auVar61._0_4_ = fVar4 * *(float *)(uVar12 + 0x120);
        auVar61._4_4_ = fVar4 * *(float *)(uVar12 + 0x124);
        auVar61._8_4_ = fVar4 * *(float *)(uVar12 + 0x128);
        auVar61._12_4_ = fVar4 * *(float *)(uVar12 + 300);
        auVar41 = vfmadd231ps_avx512vl(auVar54,auVar57,auVar38);
        auVar42 = vaddps_avx512vl(auVar57,auVar59);
        auVar43 = vaddps_avx512vl(auVar57,auVar61);
        in_ZMM16 = ZEXT1664(auVar43);
        auVar62._0_4_ = fVar5 + fVar4 * *(float *)(uVar12 + 0x130);
        auVar62._4_4_ = fVar5 + fVar4 * *(float *)(uVar12 + 0x134);
        auVar62._8_4_ = fVar5 + fVar4 * *(float *)(uVar12 + 0x138);
        auVar62._12_4_ = fVar5 + fVar4 * *(float *)(uVar12 + 0x13c);
        auVar60._0_4_ = fVar3 * auVar35._0_4_;
        auVar60._4_4_ = fVar3 * auVar35._4_4_;
        auVar60._8_4_ = fVar3 * auVar35._8_4_;
        auVar60._12_4_ = fVar3 * auVar35._12_4_;
        auVar56._0_4_ = fVar3 * auVar36._0_4_;
        auVar56._4_4_ = fVar3 * auVar36._4_4_;
        auVar56._8_4_ = fVar3 * auVar36._8_4_;
        auVar56._12_4_ = fVar3 * auVar36._12_4_;
        auVar58._0_4_ = fVar3 * auVar37._0_4_;
        auVar58._4_4_ = fVar3 * auVar37._4_4_;
        auVar58._8_4_ = fVar3 * auVar37._8_4_;
        auVar58._12_4_ = fVar3 * auVar37._12_4_;
        auVar38._4_4_ = uVar2;
        auVar38._0_4_ = uVar2;
        auVar38._8_4_ = uVar2;
        auVar38._12_4_ = uVar2;
        auVar44 = vfmadd231ps_avx512vl(auVar60,auVar38,*(undefined1 (*) [16])(uVar12 + 0x50));
        auVar45 = vfmadd231ps_avx512vl(auVar56,auVar38,*(undefined1 (*) [16])(uVar12 + 0x60));
        auVar38 = vfmadd231ps_avx512vl(auVar58,auVar38,*(undefined1 (*) [16])(uVar12 + 0x70));
        auVar46._4_4_ = uVar1;
        auVar46._0_4_ = uVar1;
        auVar46._8_4_ = uVar1;
        auVar46._12_4_ = uVar1;
        auVar44 = vfmadd231ps_avx512vl(auVar44,auVar46,*(undefined1 (*) [16])(uVar12 + 0x20));
        auVar45 = vfmadd231ps_avx512vl(auVar45,auVar46,*(undefined1 (*) [16])(uVar12 + 0x30));
        auVar38 = vfmadd231ps_avx512vl(auVar38,auVar46,*(undefined1 (*) [16])(uVar12 + 0x40));
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar47 = vandps_avx512vl(auVar44,auVar46);
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar15 = vcmpps_avx512vl(auVar47,auVar48,1);
        bVar21 = (bool)((byte)uVar15 & 1);
        iVar23 = auVar48._0_4_;
        auVar47._0_4_ = (uint)bVar21 * iVar23 | (uint)!bVar21 * auVar44._0_4_;
        bVar21 = (bool)((byte)(uVar15 >> 1) & 1);
        iVar49 = auVar48._4_4_;
        auVar47._4_4_ = (uint)bVar21 * iVar49 | (uint)!bVar21 * auVar44._4_4_;
        bVar21 = (bool)((byte)(uVar15 >> 2) & 1);
        iVar50 = auVar48._8_4_;
        iVar51 = auVar48._12_4_;
        auVar47._8_4_ = (uint)bVar21 * iVar50 | (uint)!bVar21 * auVar44._8_4_;
        bVar21 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar21 * iVar51 | (uint)!bVar21 * auVar44._12_4_;
        auVar44 = vandps_avx512vl(auVar45,auVar46);
        uVar15 = vcmpps_avx512vl(auVar44,auVar48,1);
        bVar21 = (bool)((byte)uVar15 & 1);
        auVar44._0_4_ = (uint)bVar21 * iVar23 | (uint)!bVar21 * auVar45._0_4_;
        bVar21 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar21 * iVar49 | (uint)!bVar21 * auVar45._4_4_;
        bVar21 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar21 * iVar50 | (uint)!bVar21 * auVar45._8_4_;
        bVar21 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar21 * iVar51 | (uint)!bVar21 * auVar45._12_4_;
        auVar46 = vandps_avx512vl(auVar38,auVar46);
        uVar15 = vcmpps_avx512vl(auVar46,auVar48,1);
        bVar21 = (bool)((byte)uVar15 & 1);
        auVar45._0_4_ = (uint)bVar21 * iVar23 | (uint)!bVar21 * auVar38._0_4_;
        bVar21 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar21 * iVar49 | (uint)!bVar21 * auVar38._4_4_;
        bVar21 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar21 * iVar50 | (uint)!bVar21 * auVar38._8_4_;
        bVar21 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar21 * iVar51 | (uint)!bVar21 * auVar38._12_4_;
        auVar38 = vrcp14ps_avx512vl(auVar47);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar47 = vfnmadd213ps_avx512vl(auVar47,auVar38,auVar46);
        auVar47 = vfmadd132ps_avx512vl(auVar47,auVar38,auVar38);
        auVar38 = vrcp14ps_avx512vl(auVar44);
        auVar44 = vfnmadd213ps_avx512vl(auVar44,auVar38,auVar46);
        auVar44 = vfmadd132ps_avx512vl(auVar44,auVar38,auVar38);
        auVar38 = vrcp14ps_avx512vl(auVar45);
        auVar46 = vfnmadd213ps_avx512vl(auVar45,auVar38,auVar46);
        auVar46 = vfmadd132ps_avx512vl(auVar46,auVar38,auVar38);
        auVar35 = vfmadd213ps_avx512vl(auVar35,auVar26,*(undefined1 (*) [16])(uVar12 + 0xb0));
        auVar35 = vfmadd231ps_avx512vl(auVar35,auVar25,*(undefined1 (*) [16])(uVar12 + 0x50));
        auVar36 = vfmadd213ps_avx512vl(auVar36,auVar26,*(undefined1 (*) [16])(uVar12 + 0xc0));
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar25,*(undefined1 (*) [16])(uVar12 + 0x60));
        auVar37 = vfmadd213ps_avx512vl(auVar37,auVar26,*(undefined1 (*) [16])(uVar12 + 0xd0));
        auVar37 = vfmadd231ps_avx512vl(auVar37,auVar25,*(undefined1 (*) [16])(uVar12 + 0x70));
        auVar38 = vfmadd231ps_avx512vl(auVar35,auVar24,*(undefined1 (*) [16])(uVar12 + 0x20));
        auVar45 = vfmadd231ps_avx512vl(auVar36,auVar24,*(undefined1 (*) [16])(uVar12 + 0x30));
        auVar48 = vfmadd231ps_avx512vl(auVar37,auVar24,*(undefined1 (*) [16])(uVar12 + 0x40));
        auVar35 = vsubps_avx(auVar39,auVar38);
        auVar39 = vsubps_avx512vl(auVar42,auVar38);
        auVar36 = vsubps_avx(auVar40,auVar45);
        auVar40 = vsubps_avx512vl(auVar43,auVar45);
        auVar37 = vsubps_avx(auVar41,auVar48);
        auVar38 = vsubps_avx(auVar62,auVar48);
        auVar43._0_4_ = auVar47._0_4_ * auVar35._0_4_;
        auVar43._4_4_ = auVar47._4_4_ * auVar35._4_4_;
        auVar43._8_4_ = auVar47._8_4_ * auVar35._8_4_;
        auVar43._12_4_ = auVar47._12_4_ * auVar35._12_4_;
        auVar42._0_4_ = auVar47._0_4_ * auVar39._0_4_;
        auVar42._4_4_ = auVar47._4_4_ * auVar39._4_4_;
        auVar42._8_4_ = auVar47._8_4_ * auVar39._8_4_;
        auVar42._12_4_ = auVar47._12_4_ * auVar39._12_4_;
        auVar48._0_4_ = auVar44._0_4_ * auVar36._0_4_;
        auVar48._4_4_ = auVar44._4_4_ * auVar36._4_4_;
        auVar48._8_4_ = auVar44._8_4_ * auVar36._8_4_;
        auVar48._12_4_ = auVar44._12_4_ * auVar36._12_4_;
        auVar53._0_4_ = auVar46._0_4_ * auVar37._0_4_;
        auVar53._4_4_ = auVar46._4_4_ * auVar37._4_4_;
        auVar53._8_4_ = auVar46._8_4_ * auVar37._8_4_;
        auVar53._12_4_ = auVar46._12_4_ * auVar37._12_4_;
        auVar41._0_4_ = auVar44._0_4_ * auVar40._0_4_;
        auVar41._4_4_ = auVar44._4_4_ * auVar40._4_4_;
        auVar41._8_4_ = auVar44._8_4_ * auVar40._8_4_;
        auVar41._12_4_ = auVar44._12_4_ * auVar40._12_4_;
        auVar39._0_4_ = auVar46._0_4_ * auVar38._0_4_;
        auVar39._4_4_ = auVar46._4_4_ * auVar38._4_4_;
        auVar39._8_4_ = auVar46._8_4_ * auVar38._8_4_;
        auVar39._12_4_ = auVar46._12_4_ * auVar38._12_4_;
        auVar35 = vpminsd_avx(auVar48,auVar41);
        auVar36 = vpminsd_avx(auVar53,auVar39);
        auVar35 = vmaxps_avx(auVar35,auVar36);
        auVar46 = vpminsd_avx(auVar43,auVar42);
        auVar37 = vpmaxsd_avx(auVar43,auVar42);
        auVar36 = vpmaxsd_avx(auVar48,auVar41);
        auVar38 = vpmaxsd_avx(auVar53,auVar39);
        auVar36 = vminps_avx(auVar36,auVar38);
        auVar38 = vmaxps_avx512vl(auVar33,auVar46);
        auVar35 = vmaxps_avx(auVar38,auVar35);
        auVar37 = vminps_avx512vl(auVar34,auVar37);
        auVar36 = vminps_avx(auVar37,auVar36);
        auVar37._8_4_ = 0x3f7ffffa;
        auVar37._0_8_ = 0x3f7ffffa3f7ffffa;
        auVar37._12_4_ = 0x3f7ffffa;
        auVar37 = vmulps_avx512vl(auVar35,auVar37);
        auVar35._8_4_ = 0x3f800003;
        auVar35._0_8_ = 0x3f8000033f800003;
        auVar35._12_4_ = 0x3f800003;
        auVar35 = vmulps_avx512vl(auVar36,auVar35);
        uVar8 = vcmpps_avx512vl(auVar37,auVar35,2);
        uVar22 = (uint)uVar8;
      }
      else {
        auVar52._4_4_ = fVar4;
        auVar52._0_4_ = fVar4;
        auVar52._8_4_ = fVar4;
        auVar52._12_4_ = fVar4;
        auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar19),auVar52,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + uVar19));
        auVar35 = vsubps_avx512vl(auVar35,auVar24);
        auVar36 = vmulps_avx512vl(auVar27,auVar35);
        auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar17),auVar52,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + uVar17));
        auVar35 = vsubps_avx512vl(auVar35,auVar25);
        auVar37 = vmulps_avx512vl(auVar28,auVar35);
        auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar20),auVar52,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + uVar20));
        auVar35 = vsubps_avx512vl(auVar35,auVar26);
        auVar35 = vmulps_avx512vl(auVar29,auVar35);
        auVar35 = vmaxps_avx(auVar37,auVar35);
        auVar36 = vmaxps_avx512vl(auVar33,auVar36);
        auVar35 = vmaxps_avx(auVar36,auVar35);
        auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar19 ^ 0x10)),auVar52,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar19 ^ 0x10)));
        auVar36 = vsubps_avx512vl(auVar36,auVar24);
        auVar37 = vmulps_avx512vl(auVar30,auVar36);
        auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar17 ^ 0x10)),auVar52,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar17 ^ 0x10)));
        auVar36 = vsubps_avx512vl(auVar36,auVar25);
        auVar38 = vmulps_avx512vl(auVar31,auVar36);
        auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar20 ^ 0x10)),auVar52,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar20 ^ 0x10)));
        auVar36 = vsubps_avx512vl(auVar36,auVar26);
        auVar36 = vmulps_avx512vl(auVar32,auVar36);
        auVar36 = vminps_avx(auVar38,auVar36);
        auVar37 = vminps_avx512vl(auVar34,auVar37);
        auVar36 = vminps_avx(auVar37,auVar36);
        uVar8 = vcmpps_avx512vl(auVar35,auVar36,2);
        uVar22 = (uint)uVar8;
        if (uVar13 == 6) {
          uVar9 = vcmpps_avx512vl(auVar52,*(undefined1 (*) [16])(uVar12 + 0xf0),1);
          uVar10 = vcmpps_avx512vl(auVar52,*(undefined1 (*) [16])(uVar12 + 0xe0),0xd);
          uVar22 = (uint)(byte)((byte)uVar9 & (byte)uVar10 & (byte)uVar8);
        }
      }
      if ((byte)uVar22 == 0) goto LAB_006e8f47;
      lVar16 = 0;
      for (uVar15 = (ulong)(byte)uVar22; (uVar15 & 1) == 0;
          uVar15 = uVar15 >> 1 | 0x8000000000000000) {
        lVar16 = lVar16 + 1;
      }
      uVar15 = *(ulong *)(uVar12 + lVar16 * 8);
      uVar13 = (uVar22 & 0xff) - 1 & uVar22 & 0xff;
      uVar14 = (ulong)uVar13;
      if (uVar13 != 0) {
        *puVar18 = uVar15;
        lVar16 = 0;
        for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar13 = uVar13 - 1 & uVar13;
        uVar14 = (ulong)uVar13;
        bVar21 = uVar13 == 0;
        while( true ) {
          puVar18 = puVar18 + 1;
          uVar15 = *(ulong *)(uVar12 + lVar16 * 8);
          if (bVar21) break;
          *puVar18 = uVar15;
          lVar16 = 0;
          for (uVar15 = uVar14; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar14 = uVar14 - 1 & uVar14;
          bVar21 = uVar14 == 0;
        }
      }
    }
    cVar11 = (**(code **)((long)This->leafIntersector +
                         (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 0x18))
                       (pre,ray,k,context);
    if (cVar11 != '\0') {
      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
      return bVar7;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }